

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool ON__IsCylConeHelper(ON_Line *axis,ON_Curve *curve,double tolerance,ON_Plane *plane,
                        ON_Line *line,double *r,double *h)

{
  ON_Line *pOVar1;
  bool bVar2;
  char cVar3;
  double dVar4;
  double *local_170;
  ON_3dVector local_160;
  ON_3dVector local_148;
  undefined1 local_130 [8];
  ON_3dVector x1;
  ON_3dVector x0;
  ON_3dPoint A1;
  ON_3dPoint A0;
  double a1;
  double a0;
  double local_b8;
  double local_b0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  double *local_48;
  double *h_local;
  double *r_local;
  ON_Line *line_local;
  ON_Plane *plane_local;
  double tolerance_local;
  ON_Curve *curve_local;
  ON_Line *axis_local;
  
  local_48 = h;
  h_local = r;
  r_local = (double *)line;
  line_local = (ON_Line *)plane;
  plane_local = (ON_Plane *)tolerance;
  tolerance_local = (double)curve;
  curve_local = (ON_Curve *)axis;
  bVar2 = ON_Line::IsValid(axis);
  if (bVar2) {
    if (tolerance_local == 0.0) {
      axis_local._7_1_ = false;
    }
    else {
      ON_Curve::PointAtStart(&local_60,(ON_Curve *)tolerance_local);
      *r_local = local_60.x;
      r_local[1] = local_60.y;
      r_local[2] = local_60.z;
      ON_Curve::PointAtEnd(&local_78,(ON_Curve *)tolerance_local);
      r_local[3] = local_78.x;
      r_local[4] = local_78.y;
      r_local[5] = local_78.z;
      bVar2 = ON_Line::IsValid((ON_Line *)r_local);
      if (bVar2) {
        dVar4 = ON_Line::Length((ON_Line *)r_local);
        if (2.3283064365386963e-10 < dVar4) {
          ON_Line::Tangent(&local_90,(ON_Line *)curve_local);
          line_local[1].to.x = local_90.x;
          line_local[1].to.y = local_90.y;
          line_local[1].to.z = local_90.z;
          pOVar1 = line_local + 1;
          ON_Line::Direction(&local_a8,(ON_Line *)r_local);
          dVar4 = ON_3dVector::operator*((ON_3dVector *)&pOVar1->to,&local_a8);
          *local_48 = dVar4;
          bVar2 = ON_IsValid(*local_48);
          if (bVar2) {
            if (*local_48 <= 0.0 && *local_48 != 0.0) {
              ON_3dVector::operator-((ON_3dVector *)&a0,(ON_3dVector *)&line_local[1].to);
              line_local[1].to.x = a0;
              line_local[1].to.y = local_b8;
              line_local[1].to.z = local_b0;
              *local_48 = -*local_48;
            }
            if (2.3283064365386963e-10 < *local_48) {
              a1 = -1.23432101234321e+308;
              bVar2 = ON_Line::ClosestPointTo((ON_Line *)curve_local,(ON_3dPoint *)r_local,&a1);
              if (bVar2) {
                A0.z = -1.23432101234321e+308;
                bVar2 = ON_Line::ClosestPointTo
                                  ((ON_Line *)curve_local,(ON_3dPoint *)(r_local + 3),&A0.z);
                if (bVar2) {
                  bVar2 = ON_IsValid(a1);
                  if ((bVar2) && (bVar2 = ON_IsValid(A0.z), bVar2)) {
                    ON_Line::PointAt((ON_3dPoint *)&A1.z,(ON_Line *)curve_local,a1);
                    ON_Line::PointAt((ON_3dPoint *)&x0.z,(ON_Line *)curve_local,A0.z);
                    (line_local->from).x = A1.z;
                    (line_local->from).y = A0.x;
                    (line_local->from).z = A0.y;
                    ON_3dPoint::operator-
                              ((ON_3dVector *)&x1.z,(ON_3dPoint *)r_local,(ON_3dPoint *)&A1.z);
                    ON_3dPoint::operator-
                              ((ON_3dVector *)local_130,(ON_3dPoint *)(r_local + 3),
                               (ON_3dPoint *)&x0.z);
                    dVar4 = ON_3dVector::Length((ON_3dVector *)&x1.z);
                    *h_local = dVar4;
                    dVar4 = ON_3dVector::Length((ON_3dVector *)local_130);
                    h_local[1] = dVar4;
                    dVar4 = ON_3dVector::operator*((ON_3dVector *)&x1.z,(ON_3dVector *)&x1.z);
                    if ((0.0 <= dVar4) ||
                       ((*h_local <= 2.3283064365386963e-10 ||
                        (h_local[1] <= 2.3283064365386963e-10)))) {
                      if (*h_local < h_local[1]) {
                        local_170 = (double *)local_130;
                      }
                      else {
                        local_170 = &x1.z;
                      }
                      (line_local->to).x = *local_170;
                      (line_local->to).y = local_170[1];
                      (line_local->to).z = local_170[2];
                      dVar4 = ON_3dVector::Length((ON_3dVector *)&line_local->to);
                      if (2.3283064365386963e-10 < ABS(dVar4)) {
                        bVar2 = ON_3dVector::Unitize((ON_3dVector *)&line_local->to);
                        if (bVar2) {
                          ON_CrossProduct(&local_148,(ON_3dVector *)&line_local[1].to,
                                          (ON_3dVector *)&line_local->to);
                          line_local[1].from.x = local_148.x;
                          line_local[1].from.y = local_148.y;
                          line_local[1].from.z = local_148.z;
                          bVar2 = ON_3dVector::Unitize((ON_3dVector *)(line_local + 1));
                          if (bVar2) {
                            ON_Plane::UpdateEquation((ON_Plane *)line_local);
                            bVar2 = ON_Plane::IsValid((ON_Plane *)line_local);
                            if (bVar2) {
                              ON_Line::Tangent(&local_160,(ON_Line *)r_local);
                              x1.z = local_160.x;
                              x0.x = local_160.y;
                              x0.y = local_160.z;
                              dVar4 = ON_3dVector::operator*
                                                ((ON_3dVector *)&x1.z,
                                                 (ON_3dVector *)(line_local + 1));
                              if (ABS(dVar4) <= 2.3283064365386963e-10) {
                                cVar3 = (**(code **)(*(long *)tolerance_local + 0x170))(plane_local)
                                ;
                                axis_local._7_1_ = (bool)(-cVar3 & 1);
                              }
                              else {
                                axis_local._7_1_ = false;
                              }
                            }
                            else {
                              axis_local._7_1_ = false;
                            }
                          }
                          else {
                            axis_local._7_1_ = false;
                          }
                        }
                        else {
                          axis_local._7_1_ = false;
                        }
                      }
                      else {
                        axis_local._7_1_ = false;
                      }
                    }
                    else {
                      axis_local._7_1_ = false;
                    }
                  }
                  else {
                    axis_local._7_1_ = false;
                  }
                }
                else {
                  axis_local._7_1_ = false;
                }
              }
              else {
                axis_local._7_1_ = false;
              }
            }
            else {
              axis_local._7_1_ = false;
            }
          }
          else {
            axis_local._7_1_ = false;
          }
        }
        else {
          axis_local._7_1_ = false;
        }
      }
      else {
        axis_local._7_1_ = false;
      }
    }
  }
  else {
    axis_local._7_1_ = false;
  }
  return axis_local._7_1_;
}

Assistant:

static
bool ON__IsCylConeHelper(
          const ON_Line& axis, 
          const ON_Curve* curve,
          double tolerance,
          ON_Plane& plane,
          ON_Line& line,
          double r[2],
          double& h
          )
{
  if ( !axis.IsValid() )
    return false;
  if ( !curve )
    return false;
  line.from = curve->PointAtStart();
  line.to   = curve->PointAtEnd();
  if ( !line.IsValid() )
    return false;
  if ( line.Length() <= ON_ZERO_TOLERANCE )
    return false;

  plane.zaxis = axis.Tangent();
  h = plane.zaxis*line.Direction();
  if ( !ON_IsValid(h) )
    return false;
  if ( h < 0.0 )
  {
    plane.zaxis = -plane.zaxis;
    h = -h;
  }
  if ( h <= ON_ZERO_TOLERANCE )
    return false;

  double a0 = ON_UNSET_VALUE;
  if ( !axis.ClosestPointTo(line.from,&a0) )
    return false;
  double a1 = ON_UNSET_VALUE;
  if ( !axis.ClosestPointTo(line.to,&a1) )
    return false;
  if ( !ON_IsValid(a0) || !ON_IsValid(a1) )
    return false;


  ON_3dPoint A0 = axis.PointAt(a0);
  ON_3dPoint A1 = axis.PointAt(a1);
  plane.origin = A0;
  ON_3dVector x0 = line.from - A0;
  ON_3dVector x1 = line.to   - A1;
  r[0] = x0.Length();
  r[1] = x1.Length();
  if ( x0*x0 < 0.0 && r[0] > ON_ZERO_TOLERANCE && r[1] > ON_ZERO_TOLERANCE )
    return false;
  plane.xaxis = ( r[0] >= r[1] ) ? x0 : x1;
  if (fabs(plane.xaxis.Length()) <= ON_ZERO_TOLERANCE)
    return false;
  if ( !plane.xaxis.Unitize() )
    return false;
  plane.yaxis = ON_CrossProduct(plane.zaxis,plane.xaxis);
  if ( !plane.yaxis.Unitize() )
    return false;
  plane.UpdateEquation();
  if ( !plane.IsValid() )
    return false;

  x0 = line.Tangent();
  if ( fabs(x0*plane.yaxis) > ON_ZERO_TOLERANCE )
    return false;

  return (curve->IsLinear( tolerance )?true:false);
}